

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaThread.h
# Opt level: O2

void __thiscall xmrig::CudaThread::CudaThread(CudaThread *this,Value *value)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint64_t uVar4;
  
  this->m_blocks = 0;
  this->m_threads = 0;
  this->m_affinity = -1;
  this->m_index = 0;
  this->m_bfactor = 0;
  this->m_bsleep = 0;
  if ((value->data_).f.flags == 3) {
    uVar1 = Json::getUint(value,"index",0);
    this->m_index = uVar1;
    iVar2 = Json::getInt(value,"threads",0);
    this->m_threads = iVar2;
    iVar2 = Json::getInt(value,"blocks",0);
    this->m_blocks = iVar2;
    uVar3 = Json::getUint(value,"bfactor",this->m_bfactor);
    uVar1 = 0xc;
    if (uVar3 < 0xc) {
      uVar1 = uVar3;
    }
    this->m_bfactor = uVar1;
    uVar1 = Json::getUint(value,"bsleep",this->m_bsleep);
    this->m_bsleep = uVar1;
    uVar4 = Json::getUint64(value,"affinity",this->m_affinity);
    this->m_affinity = uVar4;
  }
  return;
}

Assistant:

inline bool isValid() const                              { return m_blocks > 0 && m_threads > 0; }